

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateLdFldWithCachedType
          (Lowerer *this,Instr *instrLdFld,bool *continueAsHelperOut,LabelInstr **labelHelperOut,
          RegOpnd **typeOpndOut)

{
  uint uVar1;
  InlineCacheIndex IVar2;
  SymOpnd *this_00;
  Sym *pSVar3;
  JitArenaAllocator *alloc;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  OpndKind OVar11;
  uint16 uVar12;
  BailOutKind BVar13;
  uint uVar14;
  uint functionId;
  undefined4 *puVar15;
  PropertySymOpnd *this_01;
  JITTimeFunctionBody *pJVar16;
  FunctionJITTimeInfo *this_02;
  char16 *pcVar17;
  char16 *pcVar18;
  BVSparse<Memory::JitArenaAllocator> *pBVar19;
  LabelInstr *labelTypeCheckFailed;
  LabelInstr *labelObjCheckFailed;
  RegOpnd *pRVar20;
  IndirOpnd *src;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInfo *pBVar21;
  char16_t *pcVar22;
  char16_t *pcVar23;
  
  if (continueAsHelperOut == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17bd,"(continueAsHelperOut != nullptr)","continueAsHelperOut != nullptr");
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  *continueAsHelperOut = false;
  if (labelHelperOut == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c0,"(labelHelperOut != nullptr)","labelHelperOut != nullptr");
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  *labelHelperOut = (LabelInstr *)0x0;
  if (typeOpndOut == (RegOpnd **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c3,"(typeOpndOut != nullptr)","typeOpndOut != nullptr");
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  *typeOpndOut = (RegOpnd *)0x0;
  OVar6 = IR::Opnd::GetKind(instrLdFld->m_src1);
  if (OVar6 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17c6,"(instrLdFld->GetSrc1()->IsSymOpnd())",
                       "instrLdFld->GetSrc1()->IsSymOpnd()");
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  this_00 = (SymOpnd *)instrLdFld->m_src1;
  OVar6 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar6 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  bVar5 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar5) {
    return false;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrLdFld->m_src1);
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if (!bVar5) {
    return false;
  }
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if ((!bVar5) && (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 0x4e) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17d2,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant(this_01);
  if ((!bVar5) && (bVar5 = IR::PropertySymOpnd::NeedsLocalTypeCheck(this_01), !bVar5)) {
    return false;
  }
  bVar5 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(this_01);
  if (bVar5) {
    if ((instrLdFld->field_0x38 & 0x10) != 0) {
      BVar13 = IR::Instr::GetBailOutKind(instrLdFld);
      bVar5 = IR::IsTypeCheckBailOutKind(BVar13);
      if (bVar5) goto LAB_005cf280;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17d9,
                       "(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind())))"
                       ,
                       "!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind()))"
                      );
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
LAB_005cf280:
  bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if (((bVar5) && (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0)) &&
     (this_01->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x17dd,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar5) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar14 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,ObjTypeSpecPhase,uVar14,functionId);
  if (bVar5) {
    pcVar17 = Js::OpCodeUtil::GetOpCodeName(instrLdFld->m_opcode);
    pSVar3 = (this_01->super_SymOpnd).m_sym;
    if (pSVar3->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar5) goto LAB_005cfa2a;
      *puVar15 = 0;
    }
    uVar1 = *(uint *)&pSVar3[1]._vptr_Sym;
    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
    pcVar23 = L"ObjTypeSpecFldInfo";
    if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      pcVar23 = L"empty";
    }
    pcVar22 = L"true";
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) {
      pcVar22 = L"false";
    }
    Output::Print(L"Field load: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pcVar17,(ulong)uVar1,pcVar18,(ulong)this_01->m_inlineCacheIndex,pcVar23,pcVar22);
    Output::Flush();
  }
  bVar5 = IR::PropertySymOpnd::HasFinalType(this_01);
  if ((bVar5) &&
     ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0 ||
      (bVar5 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01->objTypeSpecFldInfo), !bVar5)))) {
    IR::PropertySymOpnd::UpdateSlotForFinalType(this_01);
  }
  if ((instrLdFld->field_0x38 & 0x10) == 0) {
    bVar5 = false;
  }
  else {
    BVar13 = IR::Instr::GetBailOutKind(instrLdFld);
    bVar5 = IR::IsTypeCheckBailOutKind(BVar13);
  }
  bVar7 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(this_01);
  bVar8 = IR::PropertySymOpnd::NeedsLocalTypeCheck(this_01);
  bVar9 = IR::PropertySymOpnd::NeedsLoadFromProtoTypeCheck(this_01);
  if ((bVar8 || bVar9) || bVar7) {
    if (bVar9) {
      if (this_01->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        alloc = this->m_func->m_alloc;
        pBVar19 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,alloc,0x3f1274);
        pBVar19->head = (Type_conflict)0x0;
        pBVar19->lastFoundIndex = (Type_conflict)0x0;
        pBVar19->alloc = alloc;
        pBVar19->lastUsedNodePrevNextField = (Type)pBVar19;
        this_01->guardedPropOps = pBVar19;
      }
      uVar14 = IR::PropertySymOpnd::GetObjTypeSpecFldId(this_01);
      IR::PropertySymOpnd::SetGuardedPropOp(this_01,uVar14);
    }
    labelTypeCheckFailed = IR::LabelInstr::New(Label,this->m_func,true);
    labelObjCheckFailed = labelTypeCheckFailed;
    if (bVar5 == false) {
      labelObjCheckFailed = IR::LabelInstr::New(Label,this->m_func,true);
    }
    pRVar20 = GenerateCachedTypeCheck
                        (this,instrLdFld,this_01,labelObjCheckFailed,labelTypeCheckFailed,
                         (LabelInstr *)0x0);
    *typeOpndOut = pRVar20;
  }
  else {
    labelTypeCheckFailed = (LabelInstr *)0x0;
    labelObjCheckFailed = (LabelInstr *)0x0;
  }
  if ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     (bVar10 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01->objTypeSpecFldInfo), !bVar10)) {
    pRVar20 = (RegOpnd *)LoadSlotArrayWithCachedLocalType(this,instrLdFld,this_01);
  }
  else {
    pRVar20 = (RegOpnd *)LoadSlotArrayWithCachedProtoType(this,instrLdFld,this_01);
  }
  uVar12 = IR::PropertySymOpnd::GetSlotIndex(this_01);
  if (uVar12 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                        ,0x1815,"(index != (uint16)-1)","index != (uint16)-1");
    if (!bVar10) goto LAB_005cfa2a;
    *puVar15 = 0;
  }
  OVar6 = IR::Opnd::GetKind(&pRVar20->super_Opnd);
  OVar11 = IR::Opnd::GetKind(&pRVar20->super_Opnd);
  if (OVar6 == OpndKindReg) {
    if (OVar11 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                          ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar10) goto LAB_005cfa2a;
      *puVar15 = 0;
    }
    src = IR::IndirOpnd::New(pRVar20,(uint)uVar12 << 3,TyInt64,this->m_func,false);
  }
  else {
    if (OVar11 != OpndKindMemRef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x181d,"(opndSlotArray->IsMemRefOpnd())","opndSlotArray->IsMemRefOpnd()")
      ;
      if (!bVar10) goto LAB_005cfa2a;
      *puVar15 = 0;
    }
    OVar6 = IR::Opnd::GetKind(&pRVar20->super_Opnd);
    if (OVar6 != OpndKindMemRef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                          ,0x1ec,"(this->IsMemRefOpnd())","Bad call to AsMemRefOpnd()");
      if (!bVar10) goto LAB_005cfa2a;
      *puVar15 = 0;
    }
    src = (IndirOpnd *)
          IR::MemRefOpnd::New(&(pRVar20->m_sym->super_Sym)._vptr_Sym + uVar12,TyInt64,this->m_func,
                              AddrOpndKindDynamicPropertySlotRef);
  }
  InsertMove(instrLdFld->m_dst,&src->super_Opnd,instrLdFld,true);
  if ((bVar7 || bVar8) || bVar9) {
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrLdFld,&instr->super_Instr);
    IR::Instr::InsertBefore(instrLdFld,&labelTypeCheckFailed->super_Instr);
    IR::Instr::InsertAfter(instrLdFld,&branchTarget->super_Instr);
    if (bVar5 == false) {
      *continueAsHelperOut = true;
      if (labelObjCheckFailed == (LabelInstr *)0x0 || labelObjCheckFailed == labelTypeCheckFailed) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x184b,
                           "(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed)"
                           ,
                           "labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed"
                          );
        if (!bVar5) goto LAB_005cfa2a;
        *puVar15 = 0;
      }
      *labelHelperOut = labelObjCheckFailed;
      return false;
    }
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015c1bd0,ObjTypeSpecIsolatedFldOpsWithBailOutPhase)
    ;
    if ((!bVar5) && (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 4) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1838,
                         "(Js::Configuration::Global.flags.On.IsEnabled((Js::ObjTypeSpecIsolatedFldOpsWithBailOutPhase)) || !propertySymOpnd->IsTypeDead())"
                         ,"Why does a field load have a type check bailout, if its type is dead?");
      if (!bVar5) {
LAB_005cfa2a:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar15 = 0;
    }
    pBVar21 = IR::Instr::GetBailOutInfo(instrLdFld);
    if (pBVar21->bailOutInstr != instrLdFld) {
      IVar2 = this_01->m_inlineCacheIndex;
      pBVar21 = IR::Instr::GetBailOutInfo(instrLdFld);
      pBVar21->polymorphicCacheIndex = IVar2;
    }
    IR::Instr::FreeDst(instrLdFld);
    IR::Instr::FreeSrc1(instrLdFld);
    instrLdFld->m_opcode = BailOut;
    GenerateBailOut(this,instrLdFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  else {
    if (labelTypeCheckFailed != (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1826,"(labelTypeCheckFailed == nullptr)",
                         "labelTypeCheckFailed == nullptr");
      if (!bVar5) goto LAB_005cfa2a;
      *puVar15 = 0;
    }
    if (((instrLdFld->field_0x38 & 0x10) != 0) &&
       (bVar5 = IR::Instr::HasLazyBailOut(instrLdFld), !bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1827,"(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut())",
                         "Why does a direct field load have bailout that is not lazy?");
      if (!bVar5) goto LAB_005cfa2a;
      *puVar15 = 0;
    }
    IR::Instr::Remove(instrLdFld);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateLdFldWithCachedType(IR::Instr * instrLdFld, bool* continueAsHelperOut, IR::LabelInstr** labelHelperOut, IR::RegOpnd** typeOpndOut)
{
    IR::Instr *instr;
    IR::Opnd *opnd;
    IR::LabelInstr *labelObjCheckFailed = nullptr;
    IR::LabelInstr *labelTypeCheckFailed = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    Assert(continueAsHelperOut != nullptr);
    *continueAsHelperOut = false;

    Assert(labelHelperOut != nullptr);
    *labelHelperOut = nullptr;

    Assert(typeOpndOut != nullptr);
    *typeOpndOut = nullptr;

    Assert(instrLdFld->GetSrc1()->IsSymOpnd());
    if (!instrLdFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return false;
    }

    IR::PropertySymOpnd *propertySymOpnd = instrLdFld->GetSrc1()->AsPropertySymOpnd();
    if (!propertySymOpnd->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");

    if (!propertySymOpnd->IsTypeCheckSeqParticipant() && !propertySymOpnd->NeedsLocalTypeCheck())
    {
        return false;
    }

    Assert(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind())));

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field load: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrLdFld->m_opcode),
        propertySymOpnd->m_sym->AsPropertySym()->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex,
        propertySymOpnd->GetCacheLayoutString(),
        propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"));

    if (propertySymOpnd->HasFinalType() && !propertySymOpnd->IsLoadedFromProto())
    {
        propertySymOpnd->UpdateSlotForFinalType();
    }

    // TODO (ObjTypeSpec): If ((PropertySym*)propertySymOpnd->m_sym)->m_stackSym->m_isIntConst consider emitting a direct
    // jump to helper or bailout.  If we have a type check bailout, we could even abort compilation.

    bool hasTypeCheckBailout = instrLdFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrLdFld->GetBailOutKind());

    // If the hard-coded type is not available here, do a type check, and branch to the helper if the check fails.
    // In the prototype case, we have to check the type even if it was checked upstream, to cover the case where
    // the property has been added locally. Note that this is not necessary if the proto chain has been checked,
    // because then we know there's been no store of the property since the type was checked.
    bool emitPrimaryTypeCheck = propertySymOpnd->NeedsPrimaryTypeCheck();
    bool emitLocalTypeCheck = propertySymOpnd->NeedsLocalTypeCheck();
    bool emitLoadFromProtoTypeCheck = propertySymOpnd->NeedsLoadFromProtoTypeCheck();
    bool emitTypeCheck = emitPrimaryTypeCheck || emitLocalTypeCheck || emitLoadFromProtoTypeCheck;

    if (emitTypeCheck)
    {
        if (emitLoadFromProtoTypeCheck)
        {
            propertySymOpnd->EnsureGuardedPropOps(this->m_func->m_alloc);
            propertySymOpnd->SetGuardedPropOp(propertySymOpnd->GetObjTypeSpecFldId());
        }
        labelTypeCheckFailed = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        labelObjCheckFailed = hasTypeCheckBailout ? labelTypeCheckFailed : IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        *typeOpndOut = this->GenerateCachedTypeCheck(instrLdFld, propertySymOpnd, labelObjCheckFailed, labelTypeCheckFailed);
    }

    IR::Opnd *opndSlotArray;
    if (propertySymOpnd->IsLoadedFromProto())
    {
        opndSlotArray = this->LoadSlotArrayWithCachedProtoType(instrLdFld, propertySymOpnd);
    }
    else
    {
        opndSlotArray = this->LoadSlotArrayWithCachedLocalType(instrLdFld, propertySymOpnd);
    }

    // Load the value from the slot, getting the slot ID from the cache.
    uint16 index = propertySymOpnd->GetSlotIndex();
    AssertOrFailFast(index != (uint16)-1);

    if (opndSlotArray->IsRegOpnd())
    {
        opnd = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, this->m_func);
    }
    else
    {
        Assert(opndSlotArray->IsMemRefOpnd());
        opnd = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, this->m_func, IR::AddrOpndKindDynamicPropertySlotRef);
    }
    Lowerer::InsertMove(instrLdFld->GetDst(), opnd, instrLdFld);

    // We eliminate the helper, or the type check succeeds, or we bail out before the operation.
    // Either delete the original instruction or replace it with a bailout.
    if (!emitPrimaryTypeCheck && !emitLocalTypeCheck && !emitLoadFromProtoTypeCheck)
    {
        Assert(labelTypeCheckFailed == nullptr);
        AssertMsg(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut(), "Why does a direct field load have bailout that is not lazy?");
        instrLdFld->Remove();
        return true;
    }

    // Otherwise, branch around the bailout or helper.
    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrLdFld->InsertBefore(instr);

    // Insert the bailout or helper label here.
    instrLdFld->InsertBefore(labelTypeCheckFailed);
    instrLdFld->InsertAfter(labelDone);

    if (hasTypeCheckBailout)
    {
        AssertMsg(PHASE_ON1(Js::ObjTypeSpecIsolatedFldOpsWithBailOutPhase) || !propertySymOpnd->IsTypeDead(),
            "Why does a field load have a type check bailout, if its type is dead?");

        // Convert the original instruction to a bailout.
        if (instrLdFld->GetBailOutInfo()->bailOutInstr != instrLdFld)
        {
            // Set the cache index in the bailout info so that the bailout code will write it into the
            // bailout record at runtime.
            instrLdFld->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        instrLdFld->FreeDst();
        instrLdFld->FreeSrc1();
        instrLdFld->m_opcode = Js::OpCode::BailOut;
        this->GenerateBailOut(instrLdFld);

        return true;
    }
    else
    {
        *continueAsHelperOut = true;
        Assert(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelTypeCheckFailed);
        *labelHelperOut = labelObjCheckFailed;
        return false;
    }
}